

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O0

bool duckdb::Hugeint::TrySubtractInPlace(hugeint_t *lhs,hugeint_t rhs)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  long in_RDX;
  long in_RSI;
  ulong *in_RDI;
  int underflow;
  
  uVar2 = (uint)(*in_RDI < *in_RDI - in_RSI);
  if (in_RDX < 0) {
    uVar1 = in_RDI[1];
    lVar3 = ::std::numeric_limits<long>::min();
    if ((lVar3 < (long)uVar1) &&
       (uVar1 = in_RDI[1], lVar3 = ::std::numeric_limits<long>::max(),
       lVar3 + in_RDX + (long)(int)uVar2 <= (long)(uVar1 - 1))) {
      return false;
    }
    in_RDI[1] = in_RDI[1] - (in_RDX + (int)uVar2);
  }
  else {
    uVar1 = in_RDI[1];
    lVar3 = ::std::numeric_limits<long>::min();
    if ((long)uVar1 < lVar3 + in_RDX + (long)(int)uVar2) {
      return false;
    }
    in_RDI[1] = (in_RDI[1] - in_RDX) - (long)(int)uVar2;
  }
  *in_RDI = *in_RDI - in_RSI;
  return true;
}

Assistant:

bool Hugeint::TrySubtractInPlace(hugeint_t &lhs, hugeint_t rhs) {
	// underflow
	int underflow = lhs.lower - rhs.lower > lhs.lower;
	if (rhs.upper >= 0) {
		// RHS is positive: check for underflow
		if (lhs.upper < (std::numeric_limits<int64_t>::min() + rhs.upper + underflow)) {
			return false;
		}
		lhs.upper = (lhs.upper - rhs.upper) - underflow;
	} else {
		// RHS is negative: check for overflow
		if (lhs.upper > std::numeric_limits<int64_t>::min() &&
		    lhs.upper - 1 >= (std::numeric_limits<int64_t>::max() + rhs.upper + underflow)) {
			return false;
		}
		lhs.upper = lhs.upper - (rhs.upper + underflow);
	}
	lhs.lower -= rhs.lower;
	return true;
}